

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall
CTcSymProp::gen_code_asi
          (CTcSymProp *this,int discard,int phase,tc_asitype_t typ,char *param_5,CTcPrsNode *rhs,
          int param_7,int param_8,void **param_9)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  undefined8 *in_R9;
  uchar in_stack_000000af;
  CTcGenTarg *in_stack_000000b0;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  iVar1 = CTcCodeStream::is_self_available(G_cs);
  if (iVar1 == 0) {
    if (in_EDX == 1) {
      sVar3 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d760b);
      uVar2 = (uint)sVar3;
      pcVar4 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d7619);
      CTcTokenizer::log_error(0x2cfb,(ulong)uVar2,pcVar4);
    }
    local_4 = 1;
  }
  else if (in_ECX == 0) {
    if (in_R9 != (undefined8 *)0x0) {
      (**(code **)*in_R9)(in_R9,0);
    }
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d7684);
    }
    CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
    CTcDataStream::write_prop_id
              ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    CTcGenTarg::note_pop((CTcGenTarg *)0x2d76bf);
    local_4 = 1;
  }
  else if (in_EDX == 1) {
    (**(code **)(*in_RDI + 0xc0))(in_RDI,0);
    local_4 = 0;
  }
  else if (in_EDX == 2) {
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d771e);
    }
    CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
    CTcDataStream::write_prop_id
              ((CTcDataStream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    CTcGenTarg::note_pop((CTcGenTarg *)0x2d7759);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcSymProp::gen_code_asi(int discard, int phase,
                             tc_asitype_t typ, const char *,
                             class CTcPrsNode *rhs,
                             int /*ignore_errors*/, int /*explicit*/,
                             void ** /*ctx*/)
{
    /* if there's no "self" object, we can't make this assignment */
    if (!G_cs->is_self_available())
    {
        /* log an error if it's phase 1 */
        if (phase == 1)
            G_tok->log_error(TCERR_SETPROP_NEEDS_OBJ,
                             (int)get_sym_len(), get_sym());

        /* 
         *   indicate that we're finished, since there's nothing more we
         *   can do here 
         */
        return TRUE;
    }

    /* check what we're doing */
    if (typ == TC_ASI_SIMPLE)
    {
        /* 
         *   Simple assignment.  Generate the right-hand side's expression
         *   for assignment, unless the caller has already done so.
         */
        if (rhs != 0)
            rhs->gen_code(FALSE, FALSE);

        /* 
         *   if we're not discarding the value, make a copy - we'll consume a
         *   copy in the SETPROP instruction, so we need one more copy to
         *   return to the enclosing expression 
         */
        if (!discard)
        {
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
        }
        
        /* 
         *   write the SETPROP instruction - use the special form to assign
         *   to "self" 
         */
        G_cg->write_op(OPC_SETPROPSELF);
        G_cs->write_prop_id(prop_);
        
        /* setpropself removes the value */
        G_cg->note_pop();

        /* handled */
        return TRUE;
    }
    else if (phase == 1)
    {
        /* 
         *   Phase 1 of a compound assignment.  Generate the property value
         *   so that the compound operator can combine it with the RHS. 
         */
        gen_code(FALSE);

        /* proceed with the unrolled assignment */
        return FALSE;
    }
    else if (phase == 2)
    {
        /* 
         *   Phase 2 of a compound assignment.  The combined value of
         *   (self.prop <op> RHS) is on the stack, so complete the
         *   assignment.  
         */

        /* if the caller will want to use the RHS value, make a copy */
        if (!discard)
        {
            G_cg->write_op(OPC_DUP);
            G_cg->note_push();
        }

        /* write the SETPROP */
        G_cg->write_op(OPC_SETPROPSELF);
        G_cs->write_prop_id(prop_);

        /* setpropself removes the value */
        G_cg->note_pop();

        /* done */
        return TRUE;
    }
    else
    {
        /* other phases aren't handled */
        return FALSE;
    }
}